

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPPacketBuilder::FillInReportBlocks
          (RTCPPacketBuilder *this,RTCPCompoundPacketBuilder *rtcpcomppack,RTPTime *curtime,
          int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)

{
  uint32_t *puVar1;
  double dVar2;
  uint32_t exthighestseq;
  RTPNTPTime RVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t lsr;
  int iVar9;
  RTPSourceData *pRVar10;
  uint uVar11;
  uint8_t fractionlost;
  uint32_t dlsr;
  int iVar12;
  int local_58;
  
  bVar6 = RTPSources::GotoFirstSource(this->sources);
  if (bVar6) {
    bVar6 = false;
    bVar8 = false;
    local_58 = 0;
    iVar12 = 0;
    do {
      pRVar10 = RTPSources::GetCurrentSourceInfo(this->sources);
      if ((((pRVar10->ownssrc == false) && (pRVar10->iscsrc == false)) &&
          ((pRVar10->stats).sentdata == true)) &&
         ((this->firstpacket != false ||
          (dVar2 = (pRVar10->stats).lastrtptime.m_t,
          (this->prevbuildtime).m_t <= dVar2 && dVar2 != (this->prevbuildtime).m_t)))) {
        if (pRVar10->processedinrtcp == true) {
          local_58 = local_58 + 1;
        }
        else {
          exthighestseq = (pRVar10->stats).exthighseqnr;
          uVar11 = exthighestseq - (pRVar10->stats).savedextseqnr;
          lsr = 0;
          fractionlost = '\0';
          puVar1 = &(pRVar10->stats).numnewpackets;
          if (*puVar1 <= uVar11) {
            fractionlost = (uint8_t)(int)(((double)(uVar11 - *puVar1) / (double)uVar11) * 256.0);
          }
          dlsr = 0;
          if ((pRVar10->SRinf).hasinfo == true) {
            RVar3 = (pRVar10->SRinf).ntptimestamp;
            lsr = RVar3.lsw >> 0x10 | RVar3.msw << 0x10;
            dlsr = (uint32_t)(long)((curtime->m_t - (pRVar10->SRinf).receivetime.m_t) * 65536.0);
          }
          iVar9 = RTCPCompoundPacketBuilder::AddReportBlock
                            (rtcpcomppack,pRVar10->ssrc,fractionlost,
                             exthighestseq -
                             ((pRVar10->stats).baseseqnr + (pRVar10->stats).packetsreceived),
                             exthighestseq,(pRVar10->stats).jitter,lsr,dlsr);
          if (iVar9 < 0) {
            bVar8 = true;
            if (iVar9 != -0x2b) {
              return iVar9;
            }
            goto LAB_0012ad15;
          }
          iVar12 = iVar12 + 1;
          if (maxcount <= iVar12) {
            bVar8 = RTPSources::GotoNextSource(this->sources);
            if (!bVar8) {
              bVar6 = true;
            }
            bVar8 = true;
          }
          (pRVar10->stats).numnewpackets = 0;
          (pRVar10->stats).savedextseqnr = (pRVar10->stats).exthighseqnr;
          pRVar10->processedinrtcp = true;
        }
      }
      if ((!bVar8) && (bVar7 = RTPSources::GotoNextSource(this->sources), !bVar7)) {
        bVar6 = true;
        bVar8 = true;
      }
    } while (!bVar8);
    bVar8 = false;
LAB_0012ad15:
    *added = iVar12;
    *skipped = local_58;
    *full = bVar8;
    if (bVar6 != false) goto LAB_0012adc4;
  }
  else {
    bVar6 = false;
    *added = 0;
    *skipped = 0;
    *full = false;
  }
  bVar4 = 0;
  do {
    pRVar10 = RTPSources::GetCurrentSourceInfo(this->sources);
    if (((pRVar10->ownssrc == false) && (pRVar10->iscsrc == false)) &&
       ((pRVar10->stats).sentdata == true)) {
      bVar5 = 1;
      if (this->firstpacket == false) {
        dVar2 = (pRVar10->stats).lastrtptime.m_t;
        if ((this->prevbuildtime).m_t <= dVar2 && dVar2 != (this->prevbuildtime).m_t) {
          bVar4 = 1;
        }
        goto LAB_0012ad8d;
      }
LAB_0012ad96:
      bVar4 = bVar5;
      if (pRVar10->processedinrtcp != false) {
        bVar4 = 0;
      }
    }
    else {
LAB_0012ad8d:
      bVar5 = bVar4;
      if (bVar4 != 0) goto LAB_0012ad96;
    }
    if ((bVar4 == 0) && (bVar8 = RTPSources::GotoNextSource(this->sources), !bVar8)) {
      bVar6 = true;
    }
  } while (!(bool)(bVar6 | bVar4));
LAB_0012adc4:
  *atendoflist = bVar6;
  return 0;
}

Assistant:

int RTCPPacketBuilder::FillInReportBlocks(RTCPCompoundPacketBuilder *rtcpcomppack,const RTPTime &curtime,int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)
{
	RTPSourceData *srcdat;
	int addedcount = 0;
	int skippedcount = 0;
	bool done = false;
	bool filled = false;
	bool atend = false;
	int status;

	if (sources.GotoFirstSource())
	{
		do
		{
			bool shouldprocess = false;
			
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}

			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP()) // already covered this one
				{
					skippedcount++;
				}
				else
				{
					uint32_t rr_ssrc = srcdat->GetSSRC();
					uint32_t num = srcdat->INF_GetNumPacketsReceivedInInterval();
					uint32_t prevseq = srcdat->INF_GetSavedExtendedSequenceNumber();
					uint32_t curseq = srcdat->INF_GetExtendedHighestSequenceNumber();
					uint32_t expected = curseq-prevseq;
					uint8_t fraclost;
					
					if (expected < num) // got duplicates
						fraclost = 0;
					else
					{
						double lost = (double)(expected-num);
						double frac = lost/((double)expected);
						fraclost = (uint8_t)(frac*256.0);
					}

					expected = curseq-srcdat->INF_GetBaseSequenceNumber();
					num = srcdat->INF_GetNumPacketsReceived();

					uint32_t diff = expected-num;
					int32_t *packlost = (int32_t *)&diff;
					
					uint32_t jitter = srcdat->INF_GetJitter();
					uint32_t lsr;
					uint32_t dlsr; 	

					if (!srcdat->SR_HasInfo())
					{
						lsr = 0;
						dlsr = 0;
					}
					else
					{
						RTPNTPTime srtime = srcdat->SR_GetNTPTimestamp();
						uint32_t m = (srtime.GetMSW()&0xFFFF);
						uint32_t l = ((srtime.GetLSW()>>16)&0xFFFF);
						lsr = ((m<<16)|l);

						RTPTime diff = curtime;
						diff -= srcdat->SR_GetReceiveTime();
						double diff2 = diff.GetDouble();
						diff2 *= 65536.0;
						dlsr = (uint32_t)diff2;
					}

					status = rtcpcomppack->AddReportBlock(rr_ssrc,fraclost,*packlost,curseq,jitter,lsr,dlsr);
					if (status < 0)
					{
						if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
						{
							done = true;
							filled = true;
						}
						else
							return status;
					}
					else
					{
						addedcount++;
						if (addedcount >= maxcount)
						{
							done = true;
							if (!sources.GotoNextSource())
								atend = true;
						}
						srcdat->INF_StartNewInterval();
						srcdat->SetProcessedInRTCP(true);
					}
				}
			}

			if (!done)
			{
				if (!sources.GotoNextSource())
				{
					atend = true;
					done = true;
				}
			}

		} while (!done);
	}
	
	*added = addedcount;
	*skipped = skippedcount;
	*full = filled;
	
	if (!atend) // search for available sources
	{
		bool shouldprocess = false;
		
		do
		{	
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}
			
			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP())
					shouldprocess = false;
			}

			if (!shouldprocess)
			{
				if (!sources.GotoNextSource())
					atend = true;
			}
	
		} while (!atend && !shouldprocess);
	}	

	*atendoflist = atend;
	return 0;	
}